

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command-bind.h
# Opt level: O2

CommandVoid4<dynamicgraph::CustomEntity,_int,_int,_int,_int> * __thiscall
dynamicgraph::command::CommandVoid4<dynamicgraph::CustomEntity,_int,_int,_int,_int>::doExecute
          (CommandVoid4<dynamicgraph::CustomEntity,_int,_int,_int,_int> *this)

{
  int iVar1;
  long *plVar2;
  long in_RSI;
  int val3;
  int val2;
  int val1;
  int val4;
  EitherType aEStack_38 [8];
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  
  plVar2 = (long *)dynamicgraph::command::Command::getParameterValues();
  if (plVar2[1] - *plVar2 == 0x40) {
    dynamicgraph::command::Command::getParameterValues();
    dynamicgraph::command::Value::value();
    iVar1 = dynamicgraph::command::EitherType::operator_cast_to_int(aEStack_38);
    dynamicgraph::command::EitherType::~EitherType(aEStack_38);
    local_28 = iVar1;
    dynamicgraph::command::Command::getParameterValues();
    dynamicgraph::command::Value::value();
    iVar1 = dynamicgraph::command::EitherType::operator_cast_to_int(aEStack_38);
    dynamicgraph::command::EitherType::~EitherType(aEStack_38);
    local_2c = iVar1;
    dynamicgraph::command::Command::getParameterValues();
    dynamicgraph::command::Value::value();
    iVar1 = dynamicgraph::command::EitherType::operator_cast_to_int(aEStack_38);
    dynamicgraph::command::EitherType::~EitherType(aEStack_38);
    local_30 = iVar1;
    dynamicgraph::command::Command::getParameterValues();
    dynamicgraph::command::Value::value();
    iVar1 = dynamicgraph::command::EitherType::operator_cast_to_int(aEStack_38);
    dynamicgraph::command::EitherType::~EitherType(aEStack_38);
    local_24 = iVar1;
    boost::function4<void,_const_int_&,_const_int_&,_const_int_&,_const_int_&>::operator()
              ((function4<void,_const_int_&,_const_int_&,_const_int_&,_const_int_&> *)
               (in_RSI + 0x60),&local_28,&local_2c,&local_30,&local_24);
    dynamicgraph::command::Value::Value((Value *)this);
    return this;
  }
  __assert_fail("getParameterValues().size() == 4",
                "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/include/dynamic-graph/command-bind.h"
                ,0x125,
                "virtual Value dynamicgraph::command::CommandVoid4<dynamicgraph::CustomEntity, int, int, int, int>::doExecute() [E = dynamicgraph::CustomEntity, T1 = int, T2 = int, T3 = int, T4 = int]"
               );
}

Assistant:

virtual Value doExecute() {
    assert(getParameterValues().size() == 4);
    T1 val1 = getParameterValues()[0].value();
    T2 val2 = getParameterValues()[1].value();
    T3 val3 = getParameterValues()[2].value();
    T4 val4 = getParameterValues()[3].value();
    fptr(val1, val2, val3, val4);
    return Value();  // void
  }